

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

_Bool ppc_cpu_tlb_fill_ppc
                (CPUState_conflict *cs,vaddr addr,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  byte *pbVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  hwaddr hVar7;
  long lVar8;
  long lVar9;
  char *fmt;
  CPUPPCState_conflict *env;
  uint eaddr;
  mmu_ctx_t local_68;
  
  env = (CPUPPCState_conflict *)(cs[1].tb_jmp_cache + 0x34f);
  if (cs[3].tb_jmp_cache[0x713] != (TranslationBlock_conflict *)0x0) {
    iVar3 = (*(code *)cs[3].tb_jmp_cache[0x713])(cs,addr,access_type,mmu_idx);
    goto switchD_009580ee_default;
  }
  if (access_type == MMU_INST_FETCH) {
    iVar5 = 0x10;
    access_type = MMU_DATA_LOAD;
  }
  else {
    iVar5 = *(int *)(cs[1].tb_jmp_cache + 0x37d);
  }
  eaddr = (uint)addr;
  iVar4 = get_physical_address_wtlb(env,&local_68,eaddr,access_type,iVar5,mmu_idx);
  if (iVar4 == 0) {
    tlb_set_page_ppc(cs,eaddr & 0xfffff000,(ulong)((uint)local_68.raddr & 0xfffff000),local_68.prot,
                     mmu_idx,0x1000);
    iVar3 = 0;
    goto switchD_009580ee_default;
  }
  iVar3 = iVar4;
  if (-1 < iVar4) goto switchD_009580ee_default;
  iVar3 = 1;
  if (iVar5 == 0x10) {
    switch(iVar4) {
    case -3:
      if ((*(uint *)((long)cs[3].tb_jmp_cache + 0x2e04) & 0xfffffffe) == 8) {
        *(undefined4 *)(cs[1].tb_jmp_cache + 0x3c5) = 0;
      }
    case -4:
      cs->exception_index = 3;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x5c5) = 0x10000000;
      break;
    case -2:
      cs->exception_index = 3;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x5c5) = 0x8000000;
      break;
    case -1:
      switch(*(undefined4 *)((long)cs[3].tb_jmp_cache + 0x2e04)) {
      case 2:
        uVar6 = 0x40000;
        lVar8 = 0x120c;
        lVar9 = 0x1208;
        iVar5 = 0x4e;
        break;
      case 3:
        cs->exception_index = 0x4e;
LAB_00958512:
        *(int *)(cs[3].tb_jmp_cache + 0x5c5) = local_68.key << 0x13;
        *(uint *)(cs[1].tb_jmp_cache + 0x590) =
             *(int *)(cs[1].tb_jmp_cache + 0x39f) - 1U &
             *(int *)((long)cs[1].tb_jmp_cache + 0x1cfc) + 1U | eaddr & 0xfffffffc;
        *(target_ulong_conflict *)((long)cs[1].tb_jmp_cache + 0x2c84) = local_68.ptem | 0x80000000;
        goto switchD_009580ee_default;
      case 4:
      case 5:
        cs->exception_index = 0xe;
        *(undefined4 *)(cs[3].tb_jmp_cache + 0x5c5) = 0;
        *(uint *)((long)cs[1].tb_jmp_cache + 0x2c84) = eaddr;
LAB_009582a3:
        *(undefined4 *)(cs[1].tb_jmp_cache + 0x590) = 0;
        goto switchD_009580ee_default;
      case 6:
switchD_0095819e_caseD_6:
        fmt = "PowerPC in real mode should never raise any MMU exceptions\n";
LAB_00958591:
        cpu_abort_ppc(cs,fmt);
      case 7:
switchD_0095819e_caseD_7:
        fmt = "MPC8xx MMU model is not implemented\n";
        goto LAB_00958591;
      case 9:
        booke206_update_mas_tlb_miss(env,eaddr,2,mmu_idx);
      case 8:
        cs->exception_index = 0xe;
        *(undefined4 *)(cs[3].tb_jmp_cache + 0x5c5) = 0;
        *(uint *)((long)cs[1].tb_jmp_cache + 0x1e24) = eaddr;
        *(uint *)(cs[1].tb_jmp_cache + 0x3c5) = (uint)((mmu_idx & 0xfffffffeU) == 8) << 6;
LAB_00958444:
        iVar3 = -1;
        goto switchD_009580ee_default;
      default:
switchD_0095819e_default:
        fmt = "Unknown or invalid MMU model\n";
        goto LAB_00958591;
      }
      goto LAB_0095845f;
    }
  }
  else {
    if (iVar4 == -4) {
      if (iVar5 == 0x50) {
        cs->exception_index = 2;
        *(undefined4 *)(cs[3].tb_jmp_cache + 0x5c5) = 0;
        *(uint *)((long)cs[1].tb_jmp_cache + 0x1d7c) = eaddr;
        if (access_type == MMU_DATA_STORE) {
          *(undefined4 *)(cs[1].tb_jmp_cache + 0x3af) = 0x6100000;
        }
        else {
          *(undefined4 *)(cs[1].tb_jmp_cache + 0x3af) = 0x4100000;
        }
      }
      else if (iVar5 == 0x40) {
        cs->exception_index = 2;
        *(undefined4 *)(cs[3].tb_jmp_cache + 0x5c5) = 0;
        *(uint *)((long)cs[1].tb_jmp_cache + 0x1d7c) = eaddr;
        if (access_type == MMU_DATA_STORE) {
          *(undefined4 *)(cs[1].tb_jmp_cache + 0x3af) = 0x6000000;
        }
        else {
          *(undefined4 *)(cs[1].tb_jmp_cache + 0x3af) = 0x4000000;
        }
      }
      else {
        if (iVar5 == 0x30) {
          cs->exception_index = 5;
          *(undefined4 *)(cs[3].tb_jmp_cache + 0x5c5) = 1;
        }
        else {
          printf("DSI: invalid exception (%d)\n",0xfffffffffffffffc);
          cs->exception_index = 6;
          *(undefined4 *)(cs[3].tb_jmp_cache + 0x5c5) = 0x21;
        }
        *(uint *)((long)cs[1].tb_jmp_cache + 0x1d7c) = eaddr;
      }
      goto switchD_009580ee_default;
    }
    if (iVar4 == -2) {
      cs->exception_index = 2;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x5c5) = 0;
      iVar5 = *(int *)((long)cs[3].tb_jmp_cache + 0x2e04);
      if (iVar5 - 8U < 2) {
        *(uint *)((long)cs[1].tb_jmp_cache + 0x1e24) = eaddr;
        iVar4 = (uint)(access_type != MMU_DATA_LOAD) * 0x800000;
        iVar5 = iVar4 + 0x40;
        if ((mmu_idx & 0xfffffffeU) != 8) {
          iVar5 = iVar4;
        }
        *(int *)(cs[1].tb_jmp_cache + 0x3c5) = iVar5;
      }
      else if (iVar5 - 4U < 2) {
        *(uint *)((long)cs[1].tb_jmp_cache + 0x2c84) = eaddr;
        if (access_type != MMU_DATA_LOAD) {
          pbVar1 = (byte *)((long)cs[1].tb_jmp_cache + 0x2c82);
          *pbVar1 = *pbVar1 | 0x80;
        }
      }
      else {
        *(uint *)((long)cs[1].tb_jmp_cache + 0x1d7c) = eaddr;
        if (access_type == MMU_DATA_STORE) {
          *(undefined4 *)(cs[1].tb_jmp_cache + 0x3af) = 0xa000000;
        }
        else {
          *(undefined4 *)(cs[1].tb_jmp_cache + 0x3af) = 0x8000000;
        }
      }
      goto switchD_009580ee_default;
    }
    if (iVar4 != -1) goto switchD_009580ee_default;
    switch(*(undefined4 *)((long)cs[3].tb_jmp_cache + 0x2e04)) {
    case 2:
      iVar5 = (access_type == MMU_DATA_STORE) + 0x4f;
      uVar6 = (uint)(access_type == MMU_DATA_STORE) << 0x10;
      lVar8 = 0x11fc;
      lVar9 = 0x11f8;
      break;
    case 3:
      if (access_type == MMU_DATA_STORE) {
        cs->exception_index = 0x50;
      }
      else {
        cs->exception_index = 0x4f;
      }
      goto LAB_00958512;
    case 4:
    case 5:
      cs->exception_index = 0xd;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x5c5) = 0;
      *(uint *)((long)cs[1].tb_jmp_cache + 0x2c84) = eaddr;
      if (access_type != MMU_DATA_LOAD) {
        *(undefined4 *)(cs[1].tb_jmp_cache + 0x590) = 0x800000;
        goto switchD_009580ee_default;
      }
      goto LAB_009582a3;
    case 6:
      goto switchD_0095819e_caseD_6;
    case 7:
      goto switchD_0095819e_caseD_7;
    case 9:
      booke206_update_mas_tlb_miss(env,eaddr,access_type,mmu_idx);
    case 8:
      cs->exception_index = 0xd;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x5c5) = 0;
      *(uint *)((long)cs[1].tb_jmp_cache + 0x1e24) = eaddr;
      iVar5 = (uint)(access_type != MMU_DATA_LOAD) * 0x800000;
      iVar3 = iVar5 + 0x40;
      if ((mmu_idx & 0xfffffffeU) != 8) {
        iVar3 = iVar5;
      }
      *(int *)(cs[1].tb_jmp_cache + 0x3c5) = iVar3;
      goto LAB_00958444;
    default:
      goto switchD_0095819e_default;
    }
LAB_0095845f:
    cs->exception_index = iVar5;
    *(uint *)((long)cs[1].tb_jmp_cache + lVar9 + 0x1a78) = eaddr;
    *(target_ulong_conflict *)((long)cs[1].tb_jmp_cache + lVar8 + 0x1a78) =
         local_68.ptem | 0x80000000;
    *(uint *)(cs[3].tb_jmp_cache + 0x5c5) = local_68.key << 0x13 | uVar6;
    uVar2 = *(ushort *)((long)cs[1].tb_jmp_cache + 0x1d96);
    hVar7 = get_pteg_offset32_ppc((PowerPCCPU_conflict *)cs,local_68.hash[0]);
    *(uint *)(cs[1].tb_jmp_cache + 0x58f) = (int)hVar7 + (uint)uVar2 * 0x10000;
    uVar2 = *(ushort *)((long)cs[1].tb_jmp_cache + 0x1d96);
    hVar7 = get_pteg_offset32_ppc((PowerPCCPU_conflict *)cs,local_68.hash[1]);
    *(uint *)((long)cs[1].tb_jmp_cache + 0x2c7c) = (int)hVar7 + (uint)uVar2 * 0x10000;
  }
switchD_009580ee_default:
  if ((iVar3 != 0) && (!probe)) {
    raise_exception_err_ra_ppc
              (env,cs->exception_index,*(uint32_t *)(cs[3].tb_jmp_cache + 0x5c5),retaddr);
  }
  return iVar3 == 0;
}

Assistant:

bool ppc_cpu_tlb_fill(CPUState *cs, vaddr addr, int size,
                      MMUAccessType access_type, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    PowerPCCPU *cpu = POWERPC_CPU(cs);
    PowerPCCPUClass *pcc = POWERPC_CPU_GET_CLASS(cs);
    CPUPPCState *env = &cpu->env;
    int ret;

    if (pcc->handle_mmu_fault) {
        ret = pcc->handle_mmu_fault(cpu, addr, access_type, mmu_idx);
    } else {
        ret = cpu_ppc_handle_mmu_fault(env, addr, access_type, mmu_idx);
    }
    if (unlikely(ret != 0)) {
        if (probe) {
            return false;
        }
        raise_exception_err_ra(env, cs->exception_index, env->error_code,
                               retaddr);
    }
    return true;
}